

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntFindMin(Vec_Int_t *p)

{
  int local_20;
  int local_1c;
  int Best;
  int i;
  Vec_Int_t *p_local;
  
  if (p->nSize == 0) {
    p_local._4_4_ = 0;
  }
  else {
    local_20 = *p->pArray;
    for (local_1c = 1; local_1c < p->nSize; local_1c = local_1c + 1) {
      if (p->pArray[local_1c] < local_20) {
        local_20 = p->pArray[local_1c];
      }
    }
    p_local._4_4_ = local_20;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Vec_IntFindMin( Vec_Int_t * p )
{
    int i, Best;
    if ( p->nSize == 0 )
        return 0;
    Best = p->pArray[0];
    for ( i = 1; i < p->nSize; i++ )
        if ( Best > p->pArray[i] )
            Best = p->pArray[i];
    return Best;
}